

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O0

void cmXMLParserEndElement(void *parser,char *name)

{
  allocator<char> local_39;
  string local_38 [32];
  char *local_18;
  char *name_local;
  void *parser_local;
  
  local_18 = name;
  name_local = (char *)parser;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,name,&local_39);
  (**(code **)(*parser + 0x48))(parser,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void cmXMLParserEndElement(void* parser, const char* name)
{
  // End element handler that is registered with the XML_Parser.  This
  // just casts the user data to a cmXMLParser and calls EndElement.
  static_cast<cmXMLParser*>(parser)->EndElement(name);
}